

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

void __thiscall
wasm::Visitor<wasm::OptimizeInstructions,_void>::visit
          (Visitor<wasm::OptimizeInstructions,_void> *this,Expression *curr)

{
  Expression *pEVar1;
  
  if (curr == (Expression *)0x0) {
    __assert_fail("curr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x3b,
                  "ReturnType wasm::Visitor<wasm::OptimizeInstructions>::visit(Expression *) [SubType = wasm::OptimizeInstructions, ReturnType = void]"
                 );
  }
  switch(curr->_id) {
  case BlockId:
  case LoopId:
  case SwitchId:
  case CallId:
  case CallIndirectId:
  case LocalGetId:
  case GlobalGetId:
  case ConstId:
  case DropId:
  case ReturnId:
  case MemorySizeId:
  case MemoryGrowId:
  case NopId:
  case UnreachableId:
  case AtomicRMWId:
  case AtomicCmpxchgId:
  case AtomicWaitId:
  case AtomicNotifyId:
  case AtomicFenceId:
  case SIMDExtractId:
  case SIMDReplaceId:
  case SIMDShuffleId:
  case SIMDTernaryId:
  case SIMDShiftId:
  case SIMDLoadId:
  case SIMDLoadStoreLaneId:
  case MemoryInitId:
  case DataDropId:
  case PopId:
  case RefNullId:
  case RefFuncId:
  case TableGetId:
  case TableSetId:
  case TableSizeId:
  case TableGrowId:
  case TableFillId:
  case TableCopyId:
  case TableInitId:
  case TryId:
  case TryTableId:
  case ThrowId:
  case RethrowId:
  case ThrowRefId:
  case TupleMakeId:
  case RefI31Id:
  case I31GetId:
  case BrOnId:
  case ArrayNewDataId:
  case ArrayNewElemId:
  case ArrayFillId:
  case ArrayInitDataId:
  case ArrayInitElemId:
  case StringNewId:
  case StringConstId:
  case StringMeasureId:
  case StringEncodeId:
  case StringConcatId:
  case StringEqId:
  case StringWTF16GetId:
  case StringSliceWTFId:
  case ContNewId:
  case ContBindId:
  case SuspendId:
  case ResumeId:
  case ResumeThrowId:
  case StackSwitchId:
    break;
  case IfId:
    OptimizeInstructions::visitIf((OptimizeInstructions *)(this + -0x58),(If *)curr);
    return;
  case BreakId:
    pEVar1 = (Expression *)curr[2].type.id;
    if (pEVar1 != (Expression *)0x0) {
      pEVar1 = OptimizeInstructions::optimizeBoolean((OptimizeInstructions *)(this + -0x58),pEVar1);
      curr[2].type.id = (uintptr_t)pEVar1;
    }
    break;
  case LocalSetId:
    OptimizeInstructions::visitLocalSet((OptimizeInstructions *)(this + -0x58),(LocalSet *)curr);
    return;
  case GlobalSetId:
    OptimizeInstructions::visitGlobalSet((OptimizeInstructions *)(this + -0x58),(GlobalSet *)curr);
    return;
  case LoadId:
    if ((curr->type).id != 1) {
      OptimizeInstructions::optimizeMemoryAccess
                ((OptimizeInstructions *)(this + -0x58),(Expression **)(curr + 3),
                 (Address *)&curr[1].type,(IString)*(IString *)&curr[3].type);
      return;
    }
    break;
  case StoreId:
    OptimizeInstructions::visitStore((OptimizeInstructions *)(this + -0x58),(Store *)curr);
    return;
  case UnaryId:
    OptimizeInstructions::visitUnary((OptimizeInstructions *)(this + -0x58),(Unary *)curr);
    return;
  case BinaryId:
    OptimizeInstructions::visitBinary((OptimizeInstructions *)(this + -0x58),(Binary *)curr);
    return;
  case SelectId:
    OptimizeInstructions::visitSelect((OptimizeInstructions *)(this + -0x58),(Select *)curr);
    return;
  case MemoryCopyId:
    OptimizeInstructions::visitMemoryCopy((OptimizeInstructions *)(this + -0x58),(MemoryCopy *)curr)
    ;
    return;
  case MemoryFillId:
    OptimizeInstructions::visitMemoryFill((OptimizeInstructions *)(this + -0x58),(MemoryFill *)curr)
    ;
    return;
  case RefIsNullId:
    OptimizeInstructions::visitRefIsNull((OptimizeInstructions *)(this + -0x58),(RefIsNull *)curr);
    return;
  case RefEqId:
    OptimizeInstructions::visitRefEq((OptimizeInstructions *)(this + -0x58),(RefEq *)curr);
    return;
  case TupleExtractId:
    OptimizeInstructions::visitTupleExtract
              ((OptimizeInstructions *)(this + -0x58),(TupleExtract *)curr);
    return;
  case CallRefId:
    OptimizeInstructions::visitCallRef((OptimizeInstructions *)(this + -0x58),(CallRef *)curr);
    return;
  case RefTestId:
    OptimizeInstructions::visitRefTest((OptimizeInstructions *)(this + -0x58),(RefTest *)curr);
    return;
  case RefCastId:
    OptimizeInstructions::visitRefCast((OptimizeInstructions *)(this + -0x58),(RefCast *)curr);
    return;
  case StructNewId:
    OptimizeInstructions::visitStructNew((OptimizeInstructions *)(this + -0x58),(StructNew *)curr);
    return;
  case StructGetId:
    OptimizeInstructions::visitStructGet((OptimizeInstructions *)(this + -0x58),(StructGet *)curr);
    return;
  case StructSetId:
    OptimizeInstructions::visitStructSet((OptimizeInstructions *)(this + -0x58),(StructSet *)curr);
    return;
  case StructRMWId:
    OptimizeInstructions::visitStructRMW((OptimizeInstructions *)(this + -0x58),(StructRMW *)curr);
    return;
  case StructCmpxchgId:
    OptimizeInstructions::visitStructCmpxchg
              ((OptimizeInstructions *)(this + -0x58),(StructCmpxchg *)curr);
    return;
  case ArrayNewId:
    OptimizeInstructions::visitArrayNew((OptimizeInstructions *)(this + -0x58),(ArrayNew *)curr);
    return;
  case ArrayNewFixedId:
    OptimizeInstructions::visitArrayNewFixed
              ((OptimizeInstructions *)(this + -0x58),(ArrayNewFixed *)curr);
    return;
  case ArrayGetId:
    OptimizeInstructions::visitArrayGet((OptimizeInstructions *)(this + -0x58),(ArrayGet *)curr);
    return;
  case ArraySetId:
    OptimizeInstructions::visitArraySet((OptimizeInstructions *)(this + -0x58),(ArraySet *)curr);
    return;
  case ArrayLenId:
    OptimizeInstructions::visitArrayLen((OptimizeInstructions *)(this + -0x58),(ArrayLen *)curr);
    return;
  case ArrayCopyId:
    OptimizeInstructions::visitArrayCopy((OptimizeInstructions *)(this + -0x58),(ArrayCopy *)curr);
    return;
  case RefAsId:
    OptimizeInstructions::visitRefAs((OptimizeInstructions *)(this + -0x58),(RefAs *)curr);
    return;
  default:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                       ,0x46);
  }
  return;
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }